

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void __thiscall
kj::UnixEventPort::FdObserver::FdObserver
          (FdObserver *this,UnixEventPort *eventPort,int fd,uint flags)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_60;
  Fault f;
  SyscallResult local_3c;
  uint local_38;
  SyscallResult _kjSyscallResult;
  epoll_event event;
  uint flags_local;
  int fd_local;
  UnixEventPort *eventPort_local;
  FdObserver *this_local;
  
  this->eventPort = eventPort;
  this->fd = fd;
  this->flags = flags;
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&this->readFulfiller);
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&this->writeFulfiller);
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&this->urgentFulfiller);
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&this->hupFulfiller);
  Maybe<bool>::Maybe(&this->atEnd);
  memset(&local_38,0,0xc);
  if ((flags & 1) != 0) {
    local_38 = local_38 | 0x2001;
  }
  if ((flags & 2) != 0) {
    local_38 = local_38 | 4;
  }
  if ((flags & 4) != 0) {
    local_38 = local_38 | 2;
  }
  local_38 = local_38 | 0x80000000;
  f.exception = (Exception *)eventPort;
  __kjSyscallResult = this;
  local_3c = kj::_::Debug::
             syscall<kj::UnixEventPort::FdObserver::FdObserver(kj::UnixEventPort&,int,unsigned_int)::__0>
                       ((anon_class_24_3_dcdeeee0 *)&f,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_3c);
  if (pvVar1 != (void *)0x0) {
    return;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_3c);
  kj::_::Debug::Fault::Fault
            (&local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x153,osErrorNumber,"epoll_ctl(eventPort.epollFd, EPOLL_CTL_ADD, fd, &event)","");
  kj::_::Debug::Fault::fatal(&local_60);
}

Assistant:

UnixEventPort::FdObserver::FdObserver(UnixEventPort& eventPort, int fd, uint flags)
    : eventPort(eventPort), fd(fd), flags(flags) {
  struct epoll_event event;
  memset(&event, 0, sizeof(event));

  if (flags & OBSERVE_READ) {
    event.events |= EPOLLIN | EPOLLRDHUP;
  }
  if (flags & OBSERVE_WRITE) {
    event.events |= EPOLLOUT;
  }
  if (flags & OBSERVE_URGENT) {
    event.events |= EPOLLPRI;
  }
  event.events |= EPOLLET;  // Set edge-triggered mode.

  event.data.ptr = this;

  KJ_SYSCALL(epoll_ctl(eventPort.epollFd, EPOLL_CTL_ADD, fd, &event));
}